

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v10::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> bStack_d8;
  
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (&bStack_d8,&this->bigits_);
  uVar11 = (uint)uVar2;
  if ((int)uVar11 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                ,0x17a,"negative value");
  }
  uVar3 = (ulong)(uVar11 * 2);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar3) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar3);
  }
  uVar4 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar3;
  if (uVar11 == 0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar4 = 1;
    if (1 < (int)uVar11) {
      uVar4 = uVar2 & 0xffffffff;
    }
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar8 = 0;
    uVar2 = 0;
    uVar3 = 0;
    puVar6 = bStack_d8.super_buffer<unsigned_int>.ptr_;
    uVar5 = uVar8;
    do {
      do {
        bVar12 = CARRY8(uVar2,(ulong)bStack_d8.super_buffer<unsigned_int>.ptr_[uVar8] *
                              (ulong)*puVar6);
        uVar2 = uVar2 + (ulong)bStack_d8.super_buffer<unsigned_int>.ptr_[uVar8] * (ulong)*puVar6;
        uVar3 = uVar3 + bVar12;
        bVar12 = uVar8 != 0;
        uVar8 = uVar8 - 1;
        puVar6 = puVar6 + 1;
      } while (bVar12);
      puVar1[uVar5] = (uint)uVar2;
      uVar2 = uVar2 >> 0x20 | uVar3 << 0x20;
      uVar3 = uVar3 >> 0x20;
      uVar8 = uVar5 + 1;
      puVar6 = bStack_d8.super_buffer<unsigned_int>.ptr_;
      uVar5 = uVar8;
    } while (uVar8 != uVar4);
  }
  if ((int)uVar11 < (int)(uVar11 * 2)) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    iVar7 = -uVar11;
    uVar4 = (ulong)(uVar11 & 0x7fffffff);
    uVar9 = 1;
    do {
      if ((int)((int)uVar4 - (uVar11 - 1)) < (int)uVar11) {
        puVar6 = bStack_d8.super_buffer<unsigned_int>.ptr_ + (int)uVar9;
        lVar10 = -1;
        do {
          bVar12 = CARRY8(uVar2,(ulong)bStack_d8.super_buffer<unsigned_int>.ptr_
                                       [(ulong)(uVar11 & 0x7fffffff) + lVar10] * (ulong)*puVar6);
          uVar2 = uVar2 + (ulong)bStack_d8.super_buffer<unsigned_int>.ptr_
                                 [(ulong)(uVar11 & 0x7fffffff) + lVar10] * (ulong)*puVar6;
          uVar3 = uVar3 + bVar12;
          lVar10 = lVar10 + -1;
          puVar6 = puVar6 + 1;
        } while (iVar7 != (int)lVar10);
      }
      puVar1[uVar4] = (uint)uVar2;
      uVar2 = uVar2 >> 0x20 | uVar3 << 0x20;
      uVar3 = uVar3 >> 0x20;
      uVar4 = uVar4 + 1;
      iVar7 = iVar7 + 1;
      bVar12 = uVar9 != uVar11;
      uVar9 = uVar9 + 1;
    } while (bVar12);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  if (bStack_d8.super_buffer<unsigned_int>.ptr_ != bStack_d8.store_) {
    operator_delete(bStack_d8.super_buffer<unsigned_int>.ptr_,
                    bStack_d8.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void square() {
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    bigits_.resize(to_unsigned(num_result_bigits));
    auto sum = uint128_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();
    }
    remove_leading_zeros();
    exp_ *= 2;
  }